

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

boundaries __thiscall fmt::v6::internal::fp::assign_float_with_boundaries<double>(fp *this,double d)

{
  boundaries bVar1;
  undefined8 extraout_RDX;
  long *in_RDI;
  fp fVar2;
  fp lower;
  fp upper;
  significand_type half_ulp;
  int min_normal_e;
  bool local_79;
  fp local_70;
  significand_type local_60;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  fp *in_stack_ffffffffffffffb0;
  uint local_48;
  ulong local_30;
  
  assign<double,_0>(in_stack_ffffffffffffffb0,
                    (double)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  local_30 = 0x10000000;
  if ((int)in_RDI[1] < -0xb2) {
    local_30 = 0x10000000L << (0x4eU - (char)(int)in_RDI[1] & 0x3f);
  }
  fp((fp *)&stack0xffffffffffffffb0,*in_RDI + local_30,(int)in_RDI[1]);
  fVar2.f = (ulong)local_48;
  fVar2._8_8_ = extraout_RDX;
  fVar2 = normalize<0>((internal *)in_stack_ffffffffffffffb0,fVar2);
  local_79 = false;
  if (*in_RDI == 0x10000000000000) {
    local_79 = -0xb2 < (int)in_RDI[1];
  }
  local_60 = fVar2.f;
  fp(&local_70,*in_RDI - (local_30 >> local_79),(int)in_RDI[1]);
  bVar1.upper = fVar2.f;
  bVar1.lower = local_70.f << ((char)local_70.e - (char)fVar2.e & 0x3fU);
  return bVar1;
}

Assistant:

boundaries assign_float_with_boundaries(Double d) {
    assign(d);
    constexpr int min_normal_e = std::numeric_limits<float>::min_exponent -
                                 std::numeric_limits<double>::digits;
    significand_type half_ulp = 1 << (std::numeric_limits<double>::digits -
                                      std::numeric_limits<float>::digits - 1);
    if (min_normal_e > e) half_ulp <<= min_normal_e - e;
    fp upper = normalize<0>(fp(f + half_ulp, e));
    fp lower = fp(
        f - (half_ulp >> ((f == implicit_bit && e > min_normal_e) ? 1 : 0)), e);
    lower.f <<= lower.e - upper.e;
    return boundaries{lower.f, upper.f};
  }